

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Redux.h
# Opt level: O0

Scalar Eigen::internal::
       redux_impl<Eigen::internal::scalar_sum_op<int,int>,Eigen::internal::redux_evaluator<Eigen::Map<Eigen::Matrix<int,-1,1,0,-1,1>const,0,Eigen::Stride<0,0>>>,3,0>
       ::run<Eigen::Map<Eigen::Matrix<int,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>>
                 (redux_evaluator<Eigen::Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                  *eval,scalar_sum_op<int,_int> *func,
                 Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *xpr)

{
  Index IVar1;
  Index index_00;
  long lVar2;
  long index_01;
  CoeffReturnType local_134;
  long local_130;
  Index index_3;
  long local_120;
  Index index_2;
  long local_110;
  Index index_1;
  eigen_packet_wrapper<__attribute__((__vector_size__(2_*_sizeof(long_long))))_long_long,_0>
  local_d8 [2];
  eigen_packet_wrapper<__attribute__((__vector_size__(2_*_sizeof(long_long))))_long_long,_0>
  local_b8 [2];
  long local_90;
  Index index;
  PacketScalar packet_res1;
  PacketScalar packet_res0;
  Scalar res;
  Index alignedEnd;
  Index alignedEnd2;
  Index alignedSize;
  Index alignedSize2;
  Index alignedStart;
  int packetAlignment;
  Index packetSize;
  Index size;
  Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *xpr_local;
  scalar_sum_op<int,_int> *func_local;
  redux_evaluator<Eigen::Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *eval_local;
  
  IVar1 = EigenBase<Eigen::Map<const_Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>
          ::size((EigenBase<Eigen::Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                  *)xpr);
  index_00 = first_default_aligned<Eigen::Map<Eigen::Matrix<int,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>>
                       ((DenseBase<Eigen::Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                         *)xpr);
  lVar2 = ((IVar1 - index_00) / 4) * 4;
  index_01 = index_00 + ((IVar1 - index_00) / 8) * 8;
  if (lVar2 == 0) {
    packet_res0.m_val[1]._4_4_ =
         mapbase_evaluator<Eigen::Map<const_Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>
         ::coeff((mapbase_evaluator<Eigen::Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
                  *)eval,0);
    for (local_130 = 1; local_130 < IVar1; local_130 = local_130 + 1) {
      local_134 = mapbase_evaluator<Eigen::Map<const_Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>
                  ::coeff((mapbase_evaluator<Eigen::Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
                           *)eval,local_130);
      packet_res0.m_val[1]._4_4_ =
           scalar_sum_op<int,_int>::operator()
                     (func,(int *)((long)packet_res0.m_val + 0xc),&local_134);
    }
  }
  else {
    mapbase_evaluator<Eigen::Map<Eigen::Matrix<int,-1,1,0,-1,1>const,0,Eigen::Stride<0,0>>,Eigen::Matrix<int,-1,1,0,-1,1>const>
    ::packet<0,Eigen::internal::eigen_packet_wrapper<long_long__vector(2),0>>
              ((mapbase_evaluator<Eigen::Map<Eigen::Matrix<int,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>,Eigen::Matrix<int,_1,1,0,_1,1>const>
                *)eval,index_00);
    if (4 < lVar2) {
      mapbase_evaluator<Eigen::Map<Eigen::Matrix<int,-1,1,0,-1,1>const,0,Eigen::Stride<0,0>>,Eigen::Matrix<int,-1,1,0,-1,1>const>
      ::packet<0,Eigen::internal::eigen_packet_wrapper<long_long__vector(2),0>>
                ((mapbase_evaluator<Eigen::Map<Eigen::Matrix<int,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>,Eigen::Matrix<int,_1,1,0,_1,1>const>
                  *)eval,index_00 + 4);
      local_90 = index_00;
      while (local_90 = local_90 + 8, local_90 < index_01) {
        mapbase_evaluator<Eigen::Map<Eigen::Matrix<int,-1,1,0,-1,1>const,0,Eigen::Stride<0,0>>,Eigen::Matrix<int,-1,1,0,-1,1>const>
        ::packet<0,Eigen::internal::eigen_packet_wrapper<long_long__vector(2),0>>
                  ((mapbase_evaluator<Eigen::Map<Eigen::Matrix<int,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>,Eigen::Matrix<int,_1,1,0,_1,1>const>
                    *)eval,local_90);
        scalar_sum_op<int,int>::
        packetOp<Eigen::internal::eigen_packet_wrapper<long_long__vector(2),0>>
                  ((scalar_sum_op<int,int> *)func,
                   (eigen_packet_wrapper<__attribute__((__vector_size__(2_*_sizeof(long_long))))_long_long,_0>
                    *)(packet_res1.m_val + 1),local_b8);
        mapbase_evaluator<Eigen::Map<Eigen::Matrix<int,-1,1,0,-1,1>const,0,Eigen::Stride<0,0>>,Eigen::Matrix<int,-1,1,0,-1,1>const>
        ::packet<0,Eigen::internal::eigen_packet_wrapper<long_long__vector(2),0>>
                  ((mapbase_evaluator<Eigen::Map<Eigen::Matrix<int,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>,Eigen::Matrix<int,_1,1,0,_1,1>const>
                    *)eval,local_90 + 4);
        scalar_sum_op<int,int>::
        packetOp<Eigen::internal::eigen_packet_wrapper<long_long__vector(2),0>>
                  ((scalar_sum_op<int,int> *)func,
                   (eigen_packet_wrapper<__attribute__((__vector_size__(2_*_sizeof(long_long))))_long_long,_0>
                    *)&index,local_d8);
      }
      scalar_sum_op<int,int>::
      packetOp<Eigen::internal::eigen_packet_wrapper<long_long__vector(2),0>>
                ((scalar_sum_op<int,int> *)func,
                 (eigen_packet_wrapper<__attribute__((__vector_size__(2_*_sizeof(long_long))))_long_long,_0>
                  *)(packet_res1.m_val + 1),
                 (eigen_packet_wrapper<__attribute__((__vector_size__(2_*_sizeof(long_long))))_long_long,_0>
                  *)&index);
      if (index_01 < index_00 + lVar2) {
        mapbase_evaluator<Eigen::Map<Eigen::Matrix<int,-1,1,0,-1,1>const,0,Eigen::Stride<0,0>>,Eigen::Matrix<int,-1,1,0,-1,1>const>
        ::packet<0,Eigen::internal::eigen_packet_wrapper<long_long__vector(2),0>>
                  ((mapbase_evaluator<Eigen::Map<Eigen::Matrix<int,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>,Eigen::Matrix<int,_1,1,0,_1,1>const>
                    *)eval,index_01);
        scalar_sum_op<int,int>::
        packetOp<Eigen::internal::eigen_packet_wrapper<long_long__vector(2),0>>
                  ((scalar_sum_op<int,int> *)func,
                   (eigen_packet_wrapper<__attribute__((__vector_size__(2_*_sizeof(long_long))))_long_long,_0>
                    *)(packet_res1.m_val + 1),
                   (eigen_packet_wrapper<__attribute__((__vector_size__(2_*_sizeof(long_long))))_long_long,_0>
                    *)&index_1);
      }
    }
    packet_res0.m_val[1]._4_4_ =
         scalar_sum_op<int,int>::
         predux<Eigen::internal::eigen_packet_wrapper<long_long__vector(2),0>>
                   ((scalar_sum_op<int,int> *)func,
                    (eigen_packet_wrapper<__attribute__((__vector_size__(2_*_sizeof(long_long))))_long_long,_0>
                     *)(packet_res1.m_val + 1));
    for (local_110 = 0; local_120 = index_00 + lVar2, local_110 < index_00;
        local_110 = local_110 + 1) {
      index_2._4_4_ =
           mapbase_evaluator<Eigen::Map<const_Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>
           ::coeff((mapbase_evaluator<Eigen::Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
                    *)eval,local_110);
      packet_res0.m_val[1]._4_4_ =
           scalar_sum_op<int,_int>::operator()
                     (func,(int *)((long)packet_res0.m_val + 0xc),(int *)((long)&index_2 + 4));
    }
    for (; local_120 < IVar1; local_120 = local_120 + 1) {
      index_3._4_4_ =
           mapbase_evaluator<Eigen::Map<const_Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>
           ::coeff((mapbase_evaluator<Eigen::Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
                    *)eval,local_120);
      packet_res0.m_val[1]._4_4_ =
           scalar_sum_op<int,_int>::operator()
                     (func,(int *)((long)packet_res0.m_val + 0xc),(int *)((long)&index_3 + 4));
    }
  }
  return packet_res0.m_val[1]._4_4_;
}

Assistant:

static Scalar run(const Evaluator &eval, const Func& func, const XprType& xpr)
  {
    const Index size = xpr.size();
    
    const Index packetSize = redux_traits<Func, Evaluator>::PacketSize;
    const int packetAlignment = unpacket_traits<PacketScalar>::alignment;
    enum {
      alignment0 = (bool(Evaluator::Flags & DirectAccessBit) && bool(packet_traits<Scalar>::AlignedOnScalar)) ? int(packetAlignment) : int(Unaligned),
      alignment = EIGEN_PLAIN_ENUM_MAX(alignment0, Evaluator::Alignment)
    };
    const Index alignedStart = internal::first_default_aligned(xpr);
    const Index alignedSize2 = ((size-alignedStart)/(2*packetSize))*(2*packetSize);
    const Index alignedSize = ((size-alignedStart)/(packetSize))*(packetSize);
    const Index alignedEnd2 = alignedStart + alignedSize2;
    const Index alignedEnd  = alignedStart + alignedSize;
    Scalar res;
    if(alignedSize)
    {
      PacketScalar packet_res0 = eval.template packet<alignment,PacketScalar>(alignedStart);
      if(alignedSize>packetSize) // we have at least two packets to partly unroll the loop
      {
        PacketScalar packet_res1 = eval.template packet<alignment,PacketScalar>(alignedStart+packetSize);
        for(Index index = alignedStart + 2*packetSize; index < alignedEnd2; index += 2*packetSize)
        {
          packet_res0 = func.packetOp(packet_res0, eval.template packet<alignment,PacketScalar>(index));
          packet_res1 = func.packetOp(packet_res1, eval.template packet<alignment,PacketScalar>(index+packetSize));
        }

        packet_res0 = func.packetOp(packet_res0,packet_res1);
        if(alignedEnd>alignedEnd2)
          packet_res0 = func.packetOp(packet_res0, eval.template packet<alignment,PacketScalar>(alignedEnd2));
      }
      res = func.predux(packet_res0);

      for(Index index = 0; index < alignedStart; ++index)
        res = func(res,eval.coeff(index));

      for(Index index = alignedEnd; index < size; ++index)
        res = func(res,eval.coeff(index));
    }
    else // too small to vectorize anything.
         // since this is dynamic-size hence inefficient anyway for such small sizes, don't try to optimize.
    {
      res = eval.coeff(0);
      for(Index index = 1; index < size; ++index)
        res = func(res,eval.coeff(index));
    }

    return res;
  }